

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86::forward_inplace(BinaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  int iVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 in_XMM1 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  __m128 afVar16;
  binary_op_pow_pack4 op;
  __m128 _b;
  binary_op_pow_pack4 local_ad;
  int local_ac;
  Mat local_a8;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  p_Var2 = this->_vptr_BinaryOp_x86[-3];
  if (bottom_top_blob->elempack != 4) {
switchD_002198ec_default:
    iVar5 = BinaryOp::forward_inplace
                      ((BinaryOp *)((long)&this->_vptr_BinaryOp_x86 + (long)p_Var2),bottom_top_blob,
                       opt);
    return iVar5;
  }
  switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
  case 0:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        fVar13 = *(float *)(*pauVar7 + 4);
        fVar14 = *(float *)(*pauVar7 + 8);
        fVar15 = *(float *)(*pauVar7 + 0xc);
        *(float *)*pauVar7 = *(float *)*pauVar7 + fVar12;
        *(float *)(*pauVar7 + 4) = fVar13 + fVar12;
        *(float *)(*pauVar7 + 8) = fVar14 + fVar12;
        *(float *)(*pauVar7 + 0xc) = fVar15 + fVar12;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 1:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        fVar13 = *(float *)(*pauVar7 + 4);
        fVar14 = *(float *)(*pauVar7 + 8);
        fVar15 = *(float *)(*pauVar7 + 0xc);
        *(float *)*pauVar7 = *(float *)*pauVar7 - fVar12;
        *(float *)(*pauVar7 + 4) = fVar13 - fVar12;
        *(float *)(*pauVar7 + 8) = fVar14 - fVar12;
        *(float *)(*pauVar7 + 0xc) = fVar15 - fVar12;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 2:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        fVar13 = *(float *)(*pauVar7 + 4);
        fVar14 = *(float *)(*pauVar7 + 8);
        fVar15 = *(float *)(*pauVar7 + 0xc);
        *(float *)*pauVar7 = *(float *)*pauVar7 * fVar12;
        *(float *)(*pauVar7 + 4) = fVar13 * fVar12;
        *(float *)(*pauVar7 + 8) = fVar14 * fVar12;
        *(float *)(*pauVar7 + 0xc) = fVar15 * fVar12;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 3:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    fVar12 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        fVar13 = *(float *)(*pauVar7 + 4);
        fVar14 = *(float *)(*pauVar7 + 8);
        fVar15 = *(float *)(*pauVar7 + 0xc);
        *(float *)*pauVar7 = *(float *)*pauVar7 * fVar12;
        *(float *)(*pauVar7 + 4) = fVar13 * fVar12;
        *(float *)(*pauVar7 + 8) = fVar14 * fVar12;
        *(float *)(*pauVar7 + 0xc) = fVar15 * fVar12;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 4:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      auVar3._4_4_ = uVar1;
      auVar3._0_4_ = uVar1;
      auVar3._8_4_ = uVar1;
      auVar3._12_4_ = uVar1;
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        auVar11 = maxps(*pauVar7,auVar3);
        *pauVar7 = auVar11;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 5:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      auVar4._4_4_ = uVar1;
      auVar4._0_4_ = uVar1;
      auVar4._8_4_ = uVar1;
      auVar4._12_4_ = uVar1;
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        auVar11 = minps(*pauVar7,auVar4);
        *pauVar7 = auVar11;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 6:
    local_48 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    local_58 = (float)bottom_top_blob->c;
    local_ac = bottom_top_blob->h * bottom_top_blob->w;
    iVar5 = 0;
    if (local_ac < 1) {
      local_ac = iVar5;
    }
    if ((int)local_58 < 1) {
      local_58 = 0.0;
    }
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    for (; (float)iVar5 != local_58; iVar5 = iVar5 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar5);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      iVar8 = local_ac;
      while (bVar10 = iVar8 != 0, iVar8 = iVar8 + -1, bVar10) {
        local_a8.data = *(void **)*pauVar7;
        local_a8.refcount = *(int **)(*pauVar7 + 8);
        afVar16 = binary_op_pow_pack4::operator()(&local_ad,(__m128 *)&local_a8,(__m128 *)&local_48)
        ;
        *(long *)*pauVar7 = afVar16._0_8_;
        *(undefined8 *)(*pauVar7 + 8) = extraout_XMM0_Qb;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 7:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    fVar12 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        auVar11._0_4_ = fVar12 - *(float *)*pauVar7;
        auVar11._4_4_ = fVar12 - *(float *)(*pauVar7 + 4);
        auVar11._8_4_ = fVar12 - *(float *)(*pauVar7 + 8);
        auVar11._12_4_ = fVar12 - *(float *)(*pauVar7 + 0xc);
        *pauVar7 = auVar11;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  case 8:
    iVar5 = bottom_top_blob->c;
    iVar9 = bottom_top_blob->h * bottom_top_blob->w;
    local_58 = *(float *)(&this->field_0xd8 + (long)p_Var2);
    iVar8 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    for (; iVar8 != iVar5; iVar8 = iVar8 + 1) {
      Mat::channel(&local_a8,bottom_top_blob,iVar8);
      pauVar7 = (undefined1 (*) [16])local_a8.data;
      Mat::~Mat(&local_a8);
      iVar6 = iVar9;
      while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
        auVar11 = *pauVar7;
        in_XMM1 = rcpps(in_XMM1,auVar11);
        fVar12 = local_58 * in_XMM1._0_4_;
        fVar13 = fStack_54 * in_XMM1._4_4_;
        fVar14 = fStack_50 * in_XMM1._8_4_;
        fVar15 = fStack_4c * in_XMM1._12_4_;
        *(float *)*pauVar7 = (local_58 - auVar11._0_4_ * fVar12) * in_XMM1._0_4_ + fVar12;
        *(float *)(*pauVar7 + 4) = (fStack_54 - auVar11._4_4_ * fVar13) * in_XMM1._4_4_ + fVar13;
        *(float *)(*pauVar7 + 8) = (fStack_50 - auVar11._8_4_ * fVar14) * in_XMM1._8_4_ + fVar14;
        *(float *)(*pauVar7 + 0xc) = (fStack_4c - auVar11._12_4_ * fVar15) * in_XMM1._12_4_ + fVar15
        ;
        pauVar7 = pauVar7 + 1;
      }
    }
    break;
  default:
    goto switchD_002198ec_default;
  }
  return 0;
}

Assistant:

int BinaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}